

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMaterialSurfaceNSC.cpp
# Opt level: O2

void __thiscall chrono::ChMaterialSurfaceNSC::ChMaterialSurfaceNSC(ChMaterialSurfaceNSC *this)

{
  ChMaterialSurface::ChMaterialSurface(&this->super_ChMaterialSurface);
  (this->super_ChMaterialSurface)._vptr_ChMaterialSurface =
       (_func_int **)&PTR__ChMaterialSurface_011615b0;
  this->complianceRoll = 0.0;
  this->complianceSpin = 0.0;
  *(undefined8 *)&(this->super_ChMaterialSurface).field_0x1c = 0;
  this->compliance = 0.0;
  this->complianceT = 0.0;
  return;
}

Assistant:

ChMaterialSurfaceNSC::ChMaterialSurfaceNSC()
    : ChMaterialSurface(),
      cohesion(0),
      dampingf(0),
      compliance(0),
      complianceT(0),
      complianceRoll(0),
      complianceSpin(0) {}